

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalDecl
          (BinaryReaderInterp *this,Index decl_index,Index count,Type type)

{
  Result RVar1;
  u32 uVar2;
  Location loc;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnLocalDecl(&this->validator_,&loc,count,type);
  if (RVar1.enum_ != Error) {
    uVar2 = this->local_count_ + count;
    this->local_count_ = uVar2;
    loc.filename._M_str = (char *)CONCAT44(uVar2,count);
    loc.filename._M_len = (size_t)type;
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::
    emplace_back<wabt::interp::LocalDesc>(&this->func_->locals,(LocalDesc *)&loc);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLocalDecl(Index decl_index,
                                       Index count,
                                       Type type) {
  CHECK_RESULT(validator_.OnLocalDecl(GetLocation(), count, type));

  local_count_ += count;
  func_->locals.push_back(LocalDesc{type, count, local_count_});
  return Result::Ok;
}